

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Ses_StoreAddEntry(Ses_Store_t *pStore,word *pTruth,int nVars,int *pArrTimeProfile,char *pSol,
                     int fResLimit)

{
  int iVar1;
  int iVar2;
  int *pTimesDest;
  int *local_50;
  Ses_TimesEntry_t *pTiEntry;
  Ses_TruthEntry_t *pTEntry;
  int fAdded;
  int key;
  int fResLimit_local;
  char *pSol_local;
  int *pArrTimeProfile_local;
  int nVars_local;
  word *pTruth_local;
  Ses_Store_t *pStore_local;
  
  if (pSol != (char *)0x0) {
    Abc_ExactNormalizeArrivalTimesForNetwork(nVars,pArrTimeProfile,pSol);
  }
  iVar1 = Ses_StoreTableHash(pTruth,nVars);
  pTiEntry = (Ses_TimesEntry_t *)pStore->pEntries[iVar1];
  while ((pTiEntry != (Ses_TimesEntry_t *)0x0 &&
         (iVar2 = Ses_StoreTruthEqual((Ses_TruthEntry_t *)pTiEntry,pTruth,nVars), iVar2 == 0))) {
    pTiEntry = pTiEntry->next;
  }
  if (pTiEntry == (Ses_TimesEntry_t *)0x0) {
    pTiEntry = (Ses_TimesEntry_t *)calloc(1,0x38);
    Ses_StoreTruthCopy((Ses_TruthEntry_t *)pTiEntry,pTruth,nVars);
    pTiEntry->next = (Ses_TimesEntry_t *)pStore->pEntries[iVar1];
    pStore->pEntries[iVar1] = (Ses_TruthEntry_t *)pTiEntry;
  }
  local_50 = (int *)pTiEntry->pNetwork;
  while ((local_50 != (int *)0x0 &&
         (iVar1 = Ses_StoreTimesEqual(pArrTimeProfile,local_50,nVars), iVar1 == 0))) {
    local_50 = *(int **)(local_50 + 10);
  }
  if (local_50 == (int *)0x0) {
    pTimesDest = (int *)calloc(1,0x38);
    Ses_StoreTimesCopy(pTimesDest,pArrTimeProfile,nVars);
    *(char **)(pTimesDest + 0xc) = pSol;
    pTimesDest[8] = fResLimit;
    *(char **)(pTimesDest + 10) = pTiEntry->pNetwork;
    pTiEntry->pNetwork = (char *)pTimesDest;
    pTEntry._4_4_ = 1;
    pStore->nEntriesCount = pStore->nEntriesCount + 1;
    if (pSol != (char *)0x0) {
      pStore->nValidEntriesCount = pStore->nValidEntriesCount + 1;
    }
  }
  else {
    pTEntry._4_4_ = 0;
  }
  if (pSol == (char *)0x0) {
    if (fResLimit == 0) {
      pStore->nUnsynthesizedImp = pStore->nUnsynthesizedImp + 1;
      pStore->pUnsynthesizedImp[nVars] = pStore->pUnsynthesizedImp[nVars] + 1;
    }
    else {
      pStore->nUnsynthesizedRL = pStore->nUnsynthesizedRL + 1;
      pStore->pUnsynthesizedRL[nVars] = pStore->pUnsynthesizedRL[nVars] + 1;
    }
  }
  else if (fResLimit == 0) {
    pStore->nSynthesizedImp = pStore->nSynthesizedImp + 1;
    pStore->pSynthesizedImp[nVars] = pStore->pSynthesizedImp[nVars] + 1;
  }
  else {
    pStore->nSynthesizedRL = pStore->nSynthesizedRL + 1;
    pStore->pSynthesizedRL[nVars] = pStore->pSynthesizedRL[nVars] + 1;
  }
  if ((pTEntry._4_4_ != 0) && (pStore->szDBName != (char *)0x0)) {
    Ses_StoreWrite(pStore,pStore->szDBName,1,0,0,0);
  }
  return pTEntry._4_4_;
}

Assistant:

int Ses_StoreAddEntry( Ses_Store_t * pStore, word * pTruth, int nVars, int * pArrTimeProfile, char * pSol, int fResLimit )
{
    int key, fAdded;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;

    if ( pSol )
        Abc_ExactNormalizeArrivalTimesForNetwork( nVars, pArrTimeProfile, pSol );

    key = Ses_StoreTableHash( pTruth, nVars );
    pTEntry = pStore->pEntries[key];

    /* does truth table already exist? */
    while ( pTEntry )
    {
        if ( Ses_StoreTruthEqual( pTEntry, pTruth, nVars ) )
            break;
        else
            pTEntry = pTEntry->next;
    }

    /* entry does not yet exist, so create new one and enqueue */
    if ( !pTEntry )
    {
        pTEntry = ABC_CALLOC( Ses_TruthEntry_t, 1 );
        Ses_StoreTruthCopy( pTEntry, pTruth, nVars );
        pTEntry->next = pStore->pEntries[key];
        pStore->pEntries[key] = pTEntry;
    }

    /* does arrival time already exist? */
    pTiEntry = pTEntry->head;
    while ( pTiEntry )
    {
        if ( Ses_StoreTimesEqual( pArrTimeProfile, pTiEntry->pArrTimeProfile, nVars ) )
            break;
        else
            pTiEntry = pTiEntry->next;
    }

    /* entry does not yet exist, so create new one and enqueue */
    if ( !pTiEntry )
    {
        pTiEntry = ABC_CALLOC( Ses_TimesEntry_t, 1 );
        Ses_StoreTimesCopy( pTiEntry->pArrTimeProfile, pArrTimeProfile, nVars );
        pTiEntry->pNetwork = pSol;
        pTiEntry->fResLimit = fResLimit;
        pTiEntry->next = pTEntry->head;
        pTEntry->head = pTiEntry;

        /* item has been added */
        fAdded = 1;
        pStore->nEntriesCount++;
        if ( pSol )
            pStore->nValidEntriesCount++;
    }
    else
    {
        //assert( 0 );
        /* item was already present */
        fAdded = 0;
    }

    /* statistics */
    if ( pSol )
    {
        if ( fResLimit )
        {
            pStore->nSynthesizedRL++;
            pStore->pSynthesizedRL[nVars]++;
        }
        else
        {
            pStore->nSynthesizedImp++;
            pStore->pSynthesizedImp[nVars]++;
        }
    }
    else
    {
        if ( fResLimit )
        {
            pStore->nUnsynthesizedRL++;
            pStore->pUnsynthesizedRL[nVars]++;
        }
        else
        {
            pStore->nUnsynthesizedImp++;
            pStore->pUnsynthesizedImp[nVars]++;
        }
    }

    if ( fAdded && pStore->szDBName )
        Ses_StoreWrite( pStore, pStore->szDBName, 1, 0, 0, 0 );

    return fAdded;
}